

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<64,unsigned_long>
               (hashfunc<unsigned_long> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  reference pvVar3;
  size_type sVar4;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar5;
  uint in_ESI;
  undefined4 in_R8D;
  byte in_R9B;
  bool result;
  keytype k;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  bool in_stack_0000006b;
  bool in_stack_0000006c;
  bool in_stack_0000006d;
  bool in_stack_0000006e;
  bool in_stack_0000006f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000070;
  undefined4 in_stack_ffffffffffffffc0;
  byte bVar6;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 inclusive_00;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Blob<64> in_stack_ffffffffffffffd0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar5 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar5 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x40,pcVar5,(ulong)in_ESI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x149b01);
  Blob<64>::Blob((Blob<64> *)&stack0xffffffffffffffd0);
  memset(&stack0xffffffffffffffd0,0,8);
  if ((local_d & 1) != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),CONCAT44(in_ESI,in_EDX)
              );
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_28,0);
    (*p_Var2)(&stack0xffffffffffffffd0,8,0,pvVar3);
  }
  inclusive_00 = (undefined1)((uint)in_stack_ffffffffffffffc4 >> 0x18);
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<64>,unsigned_long>
            ((pfHash)in_stack_ffffffffffffffd0.bytes,in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8,(bool)inclusive_00,(Blob<64> *)CONCAT44(in_ESI,in_EDX),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(in_ECX,in_R8D));
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_28);
  printf("%d keys\n",sVar4 & 0xffffffff);
  bVar6 = 1;
  bVar1 = TestHashList<unsigned_long>
                    (in_stack_00000070,in_stack_0000006f,in_stack_0000006e,in_stack_0000006d,
                     in_stack_0000006c,in_stack_0000006b);
  bVar6 = bVar1 & bVar6;
  printf("\n");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(in_ECX,in_R8D));
  return (bool)(bVar6 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}